

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O0

ggml_backend_t ggml_backend_cpu_init(void)

{
  undefined1 auVar1 [64];
  undefined4 *puVar2;
  ggml_guid_t pauVar3;
  ggml_backend_reg_t pgVar4;
  ggml_backend_dev_t pgVar5;
  undefined1 auVar6 [64];
  ggml_backend_t cpu_backend;
  ggml_backend_cpu_context *ctx;
  ggml_backend_t local_8;
  
  ggml_cpu_init();
  puVar2 = (undefined4 *)operator_new(0x30);
  if (puVar2 == (undefined4 *)0x0) {
    local_8 = (ggml_backend_t)0x0;
  }
  else {
    *puVar2 = 4;
    *(undefined8 *)(puVar2 + 2) = 0;
    *(undefined8 *)(puVar2 + 4) = 0;
    *(undefined8 *)(puVar2 + 6) = 0;
    *(undefined8 *)(puVar2 + 8) = 0;
    *(undefined8 *)(puVar2 + 10) = 0;
    local_8 = (ggml_backend_t)operator_new(0x80);
    pauVar3 = ggml_backend_cpu_guid();
    local_8->guid = pauVar3;
    auVar1._24_8_ = ggml_backend_cpu_i.graph_plan_update;
    auVar1._32_8_ = ggml_backend_cpu_i.graph_plan_compute;
    auVar1._40_8_ = ggml_backend_cpu_i.graph_compute;
    auVar1._48_8_ = ggml_backend_cpu_i.event_record;
    auVar1._56_8_ = ggml_backend_cpu_i.event_wait;
    auVar1._0_8_ = ggml_backend_cpu_i.synchronize;
    auVar1._8_8_ = ggml_backend_cpu_i.graph_plan_create;
    auVar1._16_8_ = ggml_backend_cpu_i.graph_plan_free;
    auVar6 = vmovdqu64_avx512f(auVar1);
    auVar6 = vmovdqu64_avx512f(auVar6);
    (local_8->iface).synchronize = (_func_void_ggml_backend_t *)auVar6._0_8_;
    (local_8->iface).graph_plan_create =
         (_func_ggml_backend_graph_plan_t_ggml_backend_t_ggml_cgraph_ptr *)auVar6._8_8_;
    (local_8->iface).graph_plan_free =
         (_func_void_ggml_backend_t_ggml_backend_graph_plan_t *)auVar6._16_8_;
    (local_8->iface).graph_plan_update =
         (_func_void_ggml_backend_t_ggml_backend_graph_plan_t_ggml_cgraph_ptr *)auVar6._24_8_;
    (local_8->iface).graph_plan_compute =
         (_func_ggml_status_ggml_backend_t_ggml_backend_graph_plan_t *)auVar6._32_8_;
    (local_8->iface).graph_compute =
         (_func_ggml_status_ggml_backend_t_ggml_cgraph_ptr *)auVar6._40_8_;
    (local_8->iface).event_record = (_func_void_ggml_backend_t_ggml_backend_event_t *)auVar6._48_8_;
    (local_8->iface).event_wait = (_func_void_ggml_backend_t_ggml_backend_event_t *)auVar6._56_8_;
    auVar6._40_8_ = ggml_backend_cpu_i.synchronize;
    auVar6._48_8_ = ggml_backend_cpu_i.graph_plan_create;
    auVar6._56_8_ = ggml_backend_cpu_i.graph_plan_free;
    auVar6._0_8_ = ggml_backend_cpu_i.get_name;
    auVar6._8_8_ = ggml_backend_cpu_i.free;
    auVar6._16_8_ = ggml_backend_cpu_i.set_tensor_async;
    auVar6._24_8_ = ggml_backend_cpu_i.get_tensor_async;
    auVar6._32_8_ = ggml_backend_cpu_i.cpy_tensor_async;
    auVar6 = vmovdqu64_avx512f(auVar6);
    auVar6 = vmovdqu64_avx512f(auVar6);
    (local_8->iface).get_name = (_func_char_ptr_ggml_backend_t *)auVar6._0_8_;
    (local_8->iface).free = (_func_void_ggml_backend_t *)auVar6._8_8_;
    (local_8->iface).set_tensor_async =
         (_func_void_ggml_backend_t_ggml_tensor_ptr_void_ptr_size_t_size_t *)auVar6._16_8_;
    (local_8->iface).get_tensor_async =
         (_func_void_ggml_backend_t_ggml_tensor_ptr_void_ptr_size_t_size_t *)auVar6._24_8_;
    (local_8->iface).cpy_tensor_async =
         (_func__Bool_ggml_backend_t_ggml_backend_t_ggml_tensor_ptr_ggml_tensor_ptr *)auVar6._32_8_;
    (local_8->iface).synchronize = (_func_void_ggml_backend_t *)auVar6._40_8_;
    (local_8->iface).graph_plan_create =
         (_func_ggml_backend_graph_plan_t_ggml_backend_t_ggml_cgraph_ptr *)auVar6._48_8_;
    (local_8->iface).graph_plan_free =
         (_func_void_ggml_backend_t_ggml_backend_graph_plan_t *)auVar6._56_8_;
    pgVar4 = ggml_backend_cpu_reg();
    pgVar5 = (ggml_backend_dev_t)ggml_backend_reg_dev_get(pgVar4,0);
    local_8->device = pgVar5;
    local_8->context = puVar2;
    if (local_8 == (ggml_backend_t)0x0) {
      if (puVar2 != (undefined4 *)0x0) {
        operator_delete(puVar2,0x30);
      }
      local_8 = (ggml_backend_t)0x0;
    }
  }
  return local_8;
}

Assistant:

ggml_backend_t ggml_backend_cpu_init(void) {
    // initialize CPU backend now to avoid slowing the first graph computation
    ggml_cpu_init();

    struct ggml_backend_cpu_context * ctx = new ggml_backend_cpu_context;
    if (ctx == NULL) {
        return NULL;
    }

    ctx->n_threads           = GGML_DEFAULT_N_THREADS;
    ctx->threadpool          = NULL;
    ctx->work_data           = NULL;
    ctx->work_size           = 0;
    ctx->abort_callback      = NULL;
    ctx->abort_callback_data = NULL;

    ggml_backend_t cpu_backend = new ggml_backend {
        /* .guid      = */ ggml_backend_cpu_guid(),
        /* .interface = */ ggml_backend_cpu_i,
        /* .device    = */ ggml_backend_reg_dev_get(ggml_backend_cpu_reg(), 0),
        /* .context   = */ ctx,
    };

    if (cpu_backend == NULL) {
        delete ctx;
        return NULL;
    }

    return cpu_backend;
}